

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O1

void __thiscall FDecalLib::ParseColorchanger(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  FDecalAnimator *pFVar3;
  FString faderName;
  int local_44;
  int local_40;
  int local_3c;
  FString local_38;
  
  local_38.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  FString::operator=(&local_38,sc->String);
  FScanner::MustGetStringName(sc,"{");
  local_44 = 0;
  local_40 = 0;
  local_3c = 0;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    bVar1 = FScanner::Compare(sc,"FadeStart");
    if (bVar1) {
      FScanner::MustGetFloat(sc);
      local_3c = (int)(sc->Float * 35.0);
    }
    else {
      bVar1 = FScanner::Compare(sc,"FadeTime");
      if (bVar1) {
        FScanner::MustGetFloat(sc);
        local_40 = (int)(sc->Float * 35.0);
      }
      else {
        bVar1 = FScanner::Compare(sc,"Color");
        if (bVar1) {
          FScanner::MustGetString(sc);
          local_44 = V_GetColor((DWORD *)0x0,sc);
        }
        else {
          FScanner::ScriptError(sc,"Unknown color changer parameter \'%s\'",sc->String);
        }
      }
    }
  }
  pFVar3 = (FDecalAnimator *)operator_new(0x18);
  pFVar3->_vptr_FDecalAnimator = (_func_int **)&PTR__FDecalAnimator_006f68c0;
  (pFVar3->Name).Index = 0;
  iVar2 = FName::NameManager::FindName(&FName::NameData,local_38.Chars,false);
  (pFVar3->Name).Index = iVar2;
  pFVar3->_vptr_FDecalAnimator = (_func_int **)&PTR__FDecalAnimator_006f6ac8;
  *(int *)&pFVar3->field_0xc = local_3c;
  *(int *)&pFVar3[1]._vptr_FDecalAnimator = local_40;
  *(int *)((long)&pFVar3[1]._vptr_FDecalAnimator + 4) = local_44;
  TArray<FDecalAnimator_*,_FDecalAnimator_*>::Grow
            (&Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>,1);
  Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Array
  [Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count] = pFVar3;
  Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count =
       Animators.super_TArray<FDecalAnimator_*,_FDecalAnimator_*>.Count + 1;
  FString::~FString(&local_38);
  return;
}

Assistant:

void FDecalLib::ParseColorchanger (FScanner &sc)
{
	FString faderName;
	int startTime = 0, decayTime = 0;
	PalEntry goal = 0;

	sc.MustGetString ();
	faderName = sc.String;
	sc.MustGetStringName ("{");
	
	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			FDecalColorerAnim *fader = new FDecalColorerAnim (faderName);
			fader->DecayStart = startTime;
			fader->DecayTime = decayTime;
			fader->GoalColor = goal;
			Animators.Push (fader);
			break;
		}
		else if (sc.Compare ("FadeStart"))
		{
			sc.MustGetFloat ();
			startTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("FadeTime"))
		{
			sc.MustGetFloat ();
			decayTime = (int)(sc.Float * TICRATE);
		}
		else if (sc.Compare ("Color"))
		{
			sc.MustGetString ();
			goal = V_GetColor (NULL, sc);
		}
		else
		{
			sc.ScriptError ("Unknown color changer parameter '%s'", sc.String);
		}
	}
}